

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_duplicate_set.c
# Opt level: O0

oonf_duplicate_result
oonf_duplicate_entry_add
          (oonf_duplicate_set *set,uint8_t msg_type,netaddr *originator,uint64_t seqno,
          uint64_t vtime)

{
  undefined2 uVar1;
  oonf_log_source oVar2;
  oonf_duplicate_result oVar3;
  long lVar4;
  undefined8 uVar5;
  bool bVar6;
  oonf_duplicate_entry *local_108;
  undefined1 local_fe [8];
  netaddr_str nbuf;
  oonf_duplicate_result result;
  oonf_duplicate_entry_key key;
  oonf_duplicate_entry *entry;
  uint64_t vtime_local;
  uint64_t seqno_local;
  netaddr *originator_local;
  uint8_t msg_type_local;
  oonf_duplicate_set *set_local;
  
  unique0x00012000 = *(undefined8 *)originator->_addr;
  uVar5 = *(undefined8 *)(originator->_addr + 8);
  uVar1 = *(undefined2 *)&originator->_type;
  lVar4 = avl_find(set,nbuf.buf + 0x3b);
  if (lVar4 == 0) {
    local_108 = (oonf_duplicate_entry *)0x0;
  }
  else {
    local_108 = (oonf_duplicate_entry *)(lVar4 + -0x38);
  }
  key._11_8_ = local_108;
  if (local_108 == (oonf_duplicate_entry *)0x0) {
    key._11_8_ = oonf_class_malloc(&_dupset_class);
    if ((undefined8 *)key._11_8_ == (undefined8 *)0x0) {
      return OONF_DUPSET_TOO_OLD;
    }
    *(uint64_t *)(key._11_8_ + 0x20) = seqno;
    *(undefined8 *)(key._11_8_ + 0x18) = 1;
    *(oonf_duplicate_set **)(key._11_8_ + 0x30) = set;
    *(oonf_timer_class **)(key._11_8_ + 0xa8) = &_vtime_info;
    oonf_timer_start_ext((oonf_timer_instance *)(key._11_8_ + 0x70),vtime,vtime);
    *(undefined8 *)key._11_8_ = stack0xffffffffffffff45;
    *(undefined8 *)(key._11_8_ + 8) = uVar5;
    *(undefined2 *)(key._11_8_ + 0x10) = uVar1;
    *(uint8_t *)(key._11_8_ + 0x12) = msg_type;
    *(undefined8 *)(key._11_8_ + 0x60) = key._11_8_;
    avl_insert(set,(undefined8 *)(key._11_8_ + 0x38));
    nbuf.buf[0x36] = '\x05';
    nbuf.buf[0x37] = '\0';
    nbuf.buf[0x38] = '\0';
    nbuf.buf[0x39] = '\0';
  }
  else {
    nbuf.buf._54_4_ = _test(set,local_108,seqno,true);
  }
  oVar2 = _oonf_duplicate_set_subsystem.logging;
  if (((&log_global_mask)[_oonf_duplicate_set_subsystem.logging] & 1) != 0) {
    uVar5 = netaddr_to_prefixstring(local_fe,originator,0);
    oonf_log(1,oVar2,"src/base/oonf_duplicate_set.c",0xde,0,0,
             "Test/Add msgtype %u, originator %s, seqno %lu: %s",msg_type,uVar5,seqno,
             OONF_DUPSET_RESULT_STR[(uint)nbuf.buf._54_4_]);
  }
  bVar6 = true;
  if ((nbuf.buf._54_4_ != 2) && (bVar6 = true, nbuf.buf._54_4_ != 4)) {
    bVar6 = nbuf.buf._54_4_ == 5;
  }
  if (bVar6) {
    oonf_timer_set_ext((oonf_timer_instance *)(key._11_8_ + 0x70),vtime,vtime);
  }
  oVar3._0_1_ = nbuf.buf[0x36];
  oVar3._1_1_ = nbuf.buf[0x37];
  oVar3._2_1_ = nbuf.buf[0x38];
  oVar3._3_1_ = nbuf.buf[0x39];
  return oVar3;
}

Assistant:

enum oonf_duplicate_result
oonf_duplicate_entry_add(
  struct oonf_duplicate_set *set, uint8_t msg_type, struct netaddr *originator, uint64_t seqno, uint64_t vtime)
{
  struct oonf_duplicate_entry *entry;
  struct oonf_duplicate_entry_key key;
  enum oonf_duplicate_result result;

#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str nbuf;
#endif

  /* generate combined key */
  memcpy(&key.addr, originator, sizeof(*originator));
  key.msg_type = msg_type;

  entry = avl_find_element(&set->_tree, &key, entry, _node);
  if (!entry) {
    entry = oonf_class_malloc(&_dupset_class);
    if (entry == NULL) {
      return OONF_DUPSET_TOO_OLD;
    }

    /* initialize history and current sequence number */
    entry->current = seqno;
    entry->history = 1;

    /* initialize backpointer */
    entry->set = set;

    /* initialize vtime */
    entry->_vtime.class = &_vtime_info;

    oonf_timer_start(&entry->_vtime, vtime);

    /* set key and link entry to set */
    memcpy(&entry->key, &key, sizeof(key));
    entry->_node.key = &entry->key;
    avl_insert(&set->_tree, &entry->_node);

    result = OONF_DUPSET_FIRST;
  }
  else {
    result = _test(set, entry, seqno, true);
  }
  OONF_DEBUG(LOG_DUPLICATE_SET, "Test/Add msgtype %u, originator %s, seqno %" PRIu64 ": %s", msg_type,
    netaddr_to_string(&nbuf, originator), seqno, OONF_DUPSET_RESULT_STR[result]);

  if (oonf_duplicate_is_new(result)) {
    /* reset validity timer */
    oonf_timer_set(&entry->_vtime, vtime);
  }
  return result;
}